

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

int mi_reserve_huge_os_pages_at_ex
              (size_t pages,int numa_node,size_t timeout_msecs,_Bool exclusive,
              mi_arena_id_t *arena_id)

{
  int in_ESI;
  long in_RDI;
  undefined4 *in_R8;
  mi_memid_t *in_stack_00000010;
  size_t *in_stack_00000018;
  size_t *in_stack_00000020;
  void *p;
  mi_memid_t memid;
  size_t pages_reserved;
  size_t hsize;
  int iVar1;
  
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0xffffffff;
  }
  if (in_RDI == 0) {
    iVar1 = 0;
  }
  else {
    if (in_ESI < -1) {
      in_ESI = -1;
    }
    if (-1 < in_ESI) {
      _mi_os_numa_node_count();
    }
    _mi_os_alloc_huge_os_pages
              (memid.mem.os.size,memid.mem.arena.block_index._4_4_,(mi_msecs_t)p,in_stack_00000020,
               in_stack_00000018,in_stack_00000010);
    _mi_warning_message("failed to reserve %zu GiB huge pages\n",in_RDI);
    iVar1 = 0xc;
  }
  return iVar1;
}

Assistant:

int mi_reserve_huge_os_pages_at_ex(size_t pages, int numa_node, size_t timeout_msecs, bool exclusive, mi_arena_id_t* arena_id) mi_attr_noexcept {
  if (arena_id != NULL) *arena_id = -1;
  if (pages==0) return 0;
  if (numa_node < -1) numa_node = -1;
  if (numa_node >= 0) numa_node = numa_node % _mi_os_numa_node_count();
  size_t hsize = 0;
  size_t pages_reserved = 0;
  mi_memid_t memid;
  void* p = _mi_os_alloc_huge_os_pages(pages, numa_node, timeout_msecs, &pages_reserved, &hsize, &memid);
  if (p==NULL || pages_reserved==0) {
    _mi_warning_message("failed to reserve %zu GiB huge pages\n", pages);
    return ENOMEM;
  }
  _mi_verbose_message("numa node %i: reserved %zu GiB huge pages (of the %zu GiB requested)\n", numa_node, pages_reserved, pages);

  if (!mi_manage_os_memory_ex2(p, hsize, true, numa_node, exclusive, memid, arena_id)) {
    _mi_os_free(p, hsize, memid);
    return ENOMEM;
  }
  return 0;
}